

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O1

void delete_callbacks_for_context(void *ctx)

{
  callback *ptr;
  callback *pcVar1;
  callback *pcVar2;
  callback *pcVar3;
  callback *pcVar4;
  
  if (cbhead == (callback *)0x0) {
    pcVar2 = (callback *)0x0;
    pcVar4 = (callback *)0x0;
  }
  else {
    ptr = cbhead;
    pcVar1 = (callback *)0x0;
    pcVar3 = (callback *)0x0;
    do {
      cbhead = ptr->next;
      if ((ptr->ctx == ctx) ||
         ((ptr->fn == run_idempotent_callback && (*(void **)((long)ptr->ctx + 8) == ctx)))) {
        safefree(ptr);
        pcVar2 = pcVar1;
        pcVar4 = pcVar3;
      }
      else {
        pcVar2 = ptr;
        pcVar4 = ptr;
        if (pcVar3 != (callback *)0x0) {
          pcVar1->next = ptr;
          pcVar4 = pcVar3;
        }
      }
      ptr = cbhead;
      pcVar1 = pcVar2;
      pcVar3 = pcVar4;
    } while (cbhead != (callback *)0x0);
  }
  cbhead = pcVar4;
  cbtail = pcVar2;
  if (pcVar2 != (callback *)0x0) {
    pcVar2->next = (callback *)0x0;
  }
  return;
}

Assistant:

void delete_callbacks_for_context(void *ctx)
{
    struct callback *newhead, *newtail;

    newhead = newtail = NULL;
    while (cbhead) {
        struct callback *cb = cbhead;
        cbhead = cbhead->next;
        if (cb->ctx == ctx ||
            (cb->fn == run_idempotent_callback &&
             ((struct IdempotentCallback *)cb->ctx)->ctx == ctx)) {
            sfree(cb);
        } else {
            if (!newhead)
                newhead = cb;
            else
                newtail->next = cb;

            newtail = cb;
        }
    }

    cbhead = newhead;
    cbtail = newtail;
    if (newtail)
        newtail->next = NULL;
}